

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_image_uniforms_limit
               (NegativeTestContext *ctx)

{
  int iVar1;
  RenderContext *renderCtx;
  undefined4 uVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  ostringstream shaderDecl;
  ShaderProgram program;
  ostringstream shaderBody;
  string local_548;
  string local_528;
  string local_508;
  uint local_4e8;
  value_type local_4e0;
  undefined1 local_4c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_430;
  undefined1 local_410 [32];
  undefined1 local_3f0 [376];
  ShaderProgram local_278;
  undefined1 local_1a8 [376];
  
  local_3f0._0_4_ = 0;
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x91bd,(GLint *)local_3f0);
  uVar2 = local_3f0._0_4_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"layout(rgba8, binding = 0) ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"uniform readonly highp image2D u_image[",0x27);
  iVar1 = uVar2 + 1;
  poVar3 = (ostream *)std::ostream::operator<<(local_3f0,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"layout(binding = 0) buffer Output {\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    float values[",0x11);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"} sb_out;\n",10);
  if ((uint)uVar2 < 0x7fffffff) {
    iVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    sb_out.values[",0x12);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  = imageLoad(u_image[",0x16);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"], ivec2(gl_GlobalInvocationID.xy)).x;\n",0x27);
      iVar5 = iVar5 + 1;
    } while (iVar1 != iVar5);
  }
  renderCtx = ctx->m_renderCtx;
  local_410[0x10] = 0;
  local_410._17_8_ = 0;
  local_410._0_8_ = (pointer)0x0;
  local_410[8] = 0;
  local_410._9_7_ = 0;
  memset(local_4c0,0,0xac);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_548,ctx,&local_508,&local_528);
  local_4e8 = 5;
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e0,local_548._M_dataplus._M_p,
             local_548._M_dataplus._M_p + local_548._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4c0 + (ulong)local_4e8 * 0x18),&local_4e0);
  glu::ShaderProgram::ShaderProgram(&local_278,renderCtx,(ProgramSources *)local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_410);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_430);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4c0 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_4c0._0_8_ = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_IMAGE_UNIFORMS.","");
  NegativeTestContext::beginSection(ctx,(string *)local_4c0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0._0_8_ !=
      local_4b0) {
    operator_delete((void *)local_4c0._0_8_,(ulong)(local_4b0[0]._M_dataplus._M_p + 1));
  }
  verifyLinkError(ctx,&local_278);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base((ios_base *)(local_3f0 + 0x70));
  return;
}

Assistant:

void exceed_image_uniforms_limit (NegativeTestContext& ctx)
{
	const int			limit = getResourceLimit(ctx, GL_MAX_COMPUTE_IMAGE_UNIFORMS);
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "layout(rgba8, binding = 0) "
				<< "uniform readonly highp image2D u_image[" << limit + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    float values[" << limit + 1 << "];\n"
				<< "} sb_out;\n";

	for (int i = 0; i < limit + 1; ++i)
		shaderBody	<< "    sb_out.values[" << i << "]" << "  = imageLoad(u_image[" << i << "], ivec2(gl_GlobalInvocationID.xy)).x;\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_IMAGE_UNIFORMS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}